

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O2

void P2Pt::multm3x3<float>(float (*m1) [3] [3],float (*m2) [3] [3],float (*output_m) [3])

{
  uint i;
  long lVar1;
  uint k;
  long lVar2;
  float (*pafVar3) [3];
  uint j;
  long lVar4;
  float (*pafVar5) [3];
  undefined1 auVar6 [16];
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    lVar4 = 0;
    pafVar3 = *m2;
    for (; lVar4 != 3; lVar4 = lVar4 + 1) {
      output_m[lVar1][lVar4] = 0.0;
      auVar6 = ZEXT816(0) << 0x40;
      pafVar5 = pafVar3;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)(*(float (*) [3])*pafVar5)[0]),
                                 ZEXT416((uint)(*(float (*) [3])(*m1)[0])[lVar2]));
        output_m[lVar1][lVar4] = auVar6._0_4_;
        pafVar5 = pafVar5 + 1;
      }
      pafVar3 = (float (*) [3])(*pafVar3 + 1);
    }
    m1 = (float (*) [3] [3])((long)m1 + 0xc);
  }
  return;
}

Assistant:

inline void
multm3x3(const T (&m1)[3][3], const T (&m2)[3][3], T output_m[][3])
{
	for (unsigned i = 0; i < 3; i++)
		for (unsigned j = 0; j < 3; j++) {
			output_m[i][j] = 0;
			for (unsigned k = 0; k < 3; k++)
				output_m[i][j] += m1[i][k] * m2[k][j];
		}
}